

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char **in_RSI;
  int in_EDI;
  fd_set *__arr;
  uint __i;
  int enable_canfd;
  int i;
  sockaddr_can addr;
  timeval tv;
  timeval start_tv;
  timeval timeo;
  int ret;
  int opt;
  uchar quiet;
  long lastcms;
  long currcms;
  int s;
  fd_set rdfs;
  char *in_stack_00000640;
  uint local_114;
  undefined4 local_108;
  int local_104;
  sa_family_t sVar4;
  undefined2 in_stack_ffffffffffffff02;
  uint uVar5;
  timeval local_e8;
  long in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  timeval local_c8;
  int local_b4;
  uint local_b0;
  char local_a9;
  long local_a8;
  long local_a0;
  int local_94;
  ulong local_90 [9];
  char *in_stack_ffffffffffffffb8;
  int local_4;
  
  local_a0 = 0;
  local_a8 = 0;
  local_a9 = '\0';
  local_b4 = 0;
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  for (local_104 = 0; local_104 < 0x800; local_104 = local_104 + 1) {
    sniftab[local_104].flags = sniftab[local_104].flags | 1;
  }
  while (local_b0 = getopt(in_EDI,in_RSI,"r:t:h:l:f:qeb8Bc?"), local_b0 != 0xffffffff) {
    switch(local_b0) {
    case 0x38:
      binary = '\x01';
      binary8 = '\x01';
      switchvdl("|");
      binary_gap = '\0';
      break;
    default:
      fprintf(_stderr,"Unknown option %c\n",(ulong)local_b0);
      break;
    case 0x3f:
      __xpg_basename(*in_RSI);
      print_usage(in_stack_00000640);
      exit(0);
    case 0x42:
      binary = '\x01';
      binary_gap = '\x01';
      break;
    case 0x62:
      binary = '\x01';
      binary_gap = '\0';
      break;
    case 99:
      color = '\x01';
      break;
    case 0x65:
      print_eff = 1;
      break;
    case 0x66:
      __isoc99_sscanf(_optarg,"%ld",&canfd_mode);
      if ((canfd_mode != 1) && (canfd_mode != 0)) {
        canfd_mode = 2;
      }
      break;
    case 0x68:
      __isoc99_sscanf(_optarg,"%ld",&hold);
      break;
    case 0x6c:
      __isoc99_sscanf(_optarg,"%ld",&loop);
      break;
    case 0x71:
      local_a9 = '\x01';
      break;
    case 0x72:
      iVar1 = readsettings(in_stack_ffffffffffffffb8);
      if (iVar1 < 0) {
        fprintf(_stderr,"Unable to read setting file \'%s%s\'!\n","sniffset.",_optarg);
        exit(1);
      }
      break;
    case 0x74:
      __isoc99_sscanf(_optarg,"%ld",&timeout);
    }
  }
  if (_optind != in_EDI) {
    if (local_a9 != '\0') {
      for (local_104 = 0; local_104 < 0x800; local_104 = local_104 + 1) {
        sniftab[local_104].flags = sniftab[local_104].flags & 0xfffffffe;
      }
    }
    sVar3 = strlen(in_RSI[_optind]);
    if (sVar3 < 0x10) {
      interface = in_RSI[_optind];
      local_94 = socket(0x1d,3,1);
      if (local_94 < 0) {
        perror("socket");
        local_4 = 1;
      }
      else {
        sVar4 = 0x1d;
        uVar5 = 0;
        iVar1 = strcmp("any",in_RSI[_optind]);
        if ((iVar1 == 0) || (uVar5 = if_nametoindex(in_RSI[_optind]), uVar5 != 0)) {
          if (canfd_mode != 0) {
            local_108 = 1;
            iVar1 = setsockopt(local_94,0x65,5,&local_108,4);
            if (iVar1 != 0) {
              printf("error when enabling CAN FD support\n");
              return 1;
            }
            max_dlen = 0x40;
            name_sep = '*';
            print_ascii = 0;
          }
          local_b4 = bind(local_94,(sockaddr *)&stack0xffffffffffffff00,0x18);
          if (local_b4 < 0) {
            perror("bind");
            close(local_94);
            local_4 = local_b4;
          }
          else {
            gettimeofday((timeval *)&stack0xffffffffffffff28,(__timezone_ptr_t)0x0);
            local_e8.tv_usec = 0;
            local_e8.tv_sec = 0;
            printf("%s","\x1b[?25l");
            while (running != 0) {
              for (local_114 = 0; local_114 < 0x10; local_114 = local_114 + 1) {
                local_90[local_114] = 0;
              }
              local_90[0] = local_90[0] | 1;
              local_90[local_94 / 0x40] =
                   1L << ((byte)((long)local_94 % 0x40) & 0x3f) | local_90[local_94 / 0x40];
              local_c8.tv_sec = 0;
              local_c8.tv_usec = loop * 10000;
              local_b4 = select(local_94 + 1,(fd_set *)local_90,(fd_set *)0x0,(fd_set *)0x0,
                                &local_c8);
              if (local_b4 < 0) {
                running = 0;
              }
              else {
                local_b4 = 0;
                gettimeofday(&local_e8,(__timezone_ptr_t)0x0);
                local_a0 = (local_e8.tv_sec - in_stack_ffffffffffffff28) * 100 +
                           local_e8.tv_usec / 10000;
                if ((local_90[0] & 1) != 0) {
                  uVar2 = handle_keyb();
                  running = uVar2 & running;
                }
                if ((local_90[local_94 / 0x40] & 1L << ((byte)((long)local_94 % 0x40) & 0x3f)) != 0)
                {
                  uVar2 = handle_frame(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
                  running = uVar2 & running;
                }
                if (loop <= local_a0 - local_a8) {
                  uVar2 = handle_timeo(CONCAT44(uVar5,CONCAT22(in_stack_ffffffffffffff02,sVar4)));
                  running = uVar2 & running;
                  local_a8 = local_a0;
                }
              }
            }
            printf("%s","\x1b[?25h");
            close(local_94);
            if (signal_num == 0) {
              local_4 = local_b4;
            }
            else {
              local_4 = signal_num + 0x80;
            }
          }
        }
        else {
          perror("if_nametoindex");
          local_4 = 1;
        }
      }
    }
    else {
      printf("name of CAN device \'%s\' is too long!\n",in_RSI[_optind]);
      local_4 = 1;
    }
    return local_4;
  }
  __xpg_basename(*in_RSI);
  print_usage(in_stack_00000640);
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	fd_set rdfs;
	int s;
	long currcms = 0;
	long lastcms = 0;
	unsigned char quiet = 0;
	int opt, ret = 0;
	struct timeval timeo, start_tv, tv;
	struct sockaddr_can addr;
	int i;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	for (i = 0; i < MAX_SLOTS ;i++) /* default: enable all slots */
		do_set(i, ENABLE);

	while ((opt = getopt(argc, argv, "r:t:h:l:f:qeb8Bc?")) != -1) {
		switch (opt) {
		case 'r':
			if (readsettings(optarg) < 0) {
				fprintf(stderr, "Unable to read setting file '%s%s'!\n", SETFNAME, optarg);
				exit(1);
			}
			break;

		case 't':
			sscanf(optarg, "%ld", &timeout);
			break;

		case 'h':
			sscanf(optarg, "%ld", &hold);
			break;

		case 'l':
			sscanf(optarg, "%ld", &loop);
			break;

		case 'f':
			sscanf(optarg, "%ld", &canfd_mode);
			if ((canfd_mode != CANFD_ON) && (canfd_mode != CANFD_OFF))
				canfd_mode = CANFD_AUTO;
			break;

		case 'q':
			quiet = 1;
			break;

		case 'e':
			print_eff = 1;
			break;

		case 'b':
			binary = 1;
			binary_gap = 0;
			break;

		case '8':
			binary = 1;
			binary8 = 1; /* enable variable delimiter for EFF */
			switchvdl(SDL); /* switch directly to short delimiter */
			binary_gap = 0;
			break;

		case 'B':
			binary = 1;
			binary_gap = 1;
			break;

		case 'c':
			color = 1;
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			break;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		exit(0);
	}

	if (quiet)
		for (i = 0; i < MAX_SLOTS; i++)
			do_clr(i, ENABLE);

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("name of CAN device '%s' is too long!\n", argv[optind]);
		return 1;
	}

	interface = argv[optind];

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = 0; /* 'any' CAN interface */

	/* check for specific CAN interface */
	if (strcmp(ANYDEV, argv[optind]) != 0) {
		addr.can_ifindex = if_nametoindex(argv[optind]);
		if (!addr.can_ifindex) {
			perror("if_nametoindex");
			return 1;
		}
	}

	/* enable CAN FD if not disabled by command line option */
	if (canfd_mode != CANFD_OFF) {
		const int enable_canfd = 1;

		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES,
			       &enable_canfd, sizeof(enable_canfd))){
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* might be changed in CANFD_AUTO mode */
		max_dlen = CANFD_MAX_DLEN;
		name_sep = FD_SEP;
		print_ascii = 0; /* don't print ASCII for CAN FD by default */
	}

	ret = bind(s, (struct sockaddr *)&addr, sizeof(addr));
	if (ret < 0) {
		perror("bind");
		close(s);
		return ret;
	}

	gettimeofday(&start_tv, NULL);
	tv.tv_sec = tv.tv_usec = 0;

	printf("%s", CSR_HIDE); /* hide cursor */

	while (running) {

		FD_ZERO(&rdfs);
		FD_SET(0, &rdfs);
		FD_SET(s, &rdfs);

		timeo.tv_sec  = 0;
		timeo.tv_usec = 10000 * loop;

		ret = select(s+1, &rdfs, NULL, NULL, &timeo);
		if (ret < 0) {
			//perror("select");
			running = 0;
			continue;
		} else
			ret = 0;

		gettimeofday(&tv, NULL);
		currcms = (tv.tv_sec - start_tv.tv_sec) * 100 + (tv.tv_usec / 10000);

		if (FD_ISSET(0, &rdfs))
			running &= handle_keyb();

		if (FD_ISSET(s, &rdfs))
			running &= handle_frame(s, currcms);

		if (currcms - lastcms >= loop) {
			running &= handle_timeo(currcms);
			lastcms = currcms;
		}
	}

	printf("%s", CSR_SHOW); /* show cursor */

	close(s);

	if (signal_num)
		return 128 + signal_num;

	return ret;
}